

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Expr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                   *this)

{
  StringRef value;
  Expr else_expr_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ExprBase condition_00;
  Expr then_expr_00;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_RDI;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  char c;
  int in_stack_000000a4;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_000000a8;
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff98;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined2 uVar5;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffe8;
  ExprBase local_8;
  
  uVar5 = (undefined2)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
  cVar1 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
  iVar2 = (int)cVar1;
  if (iVar2 == 0x68) {
    this_00 = in_RDI->handler_;
    BinaryReader<mp::internal::EndiannessConverter>::ReadString
              ((BinaryReader<mp::internal::EndiannessConverter> *)in_RDI);
    value.size_._0_4_ = in_stack_ffffffffffffff98;
    value.data_ = (char *)in_RDI;
    value.size_._4_4_ = iVar2;
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::OnString((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                             *)this_00,value);
  }
  else if (iVar2 == 0x6f) {
    iVar3 = ReadOpCode(in_RDI);
    iVar4 = mp::expr::nl_opcode(IFSYM);
    if (iVar3 == iVar4) {
      ReadLogicalExpr(in_stack_ffffffffffffffa8);
      condition_00.impl_ =
           (Impl *)ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                                     *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      then_expr_00 = ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                                       *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      else_expr_00.super_ExprBase.impl_._4_4_ = iVar2;
      else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_ffffffffffffff98;
      local_8.impl_ =
           (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                   ::OnSymbolicIf((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                                   *)in_RDI,(LogicalExpr)condition_00.impl_,
                                  (Expr)then_expr_00.super_ExprBase.impl_,else_expr_00);
    }
    else {
      local_8.impl_ = (Impl *)ReadNumericExpr(in_stack_000000a8,in_stack_000000a4);
    }
  }
  else {
    local_8.impl_ =
         (Impl *)ReadNumericExpr(in_stack_ffffffffffffffc8,(char)((ushort)uVar5 >> 8),SUB21(uVar5,0)
                                );
  }
  return (Expr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}